

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord3.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord3::Encode
          (RectangularVolumeRecord3 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  (*(this->m_CentLocation).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_CentLocation,stream);
  (*(this->m_RecLength).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RecLength,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  return;
}

Assistant:

void RectangularVolumeRecord3::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << KDIS_STREAM m_RecLength
           << KDIS_STREAM m_Ori;
}